

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv6Transmitter::GetTransmissionInfo(RTPUDPv6Transmitter *this)

{
  RTPMemoryManager *mgr;
  RTPUDPv6Transmitter *this_00;
  list<in6_addr,_std::allocator<in6_addr>_> local_38;
  RTPTransmissionInfo *tinf;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local = (RTPUDPv6Transmitter *)0x0;
  }
  else {
    tinf = (RTPTransmissionInfo *)this;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    this_00 = (RTPUDPv6Transmitter *)operator_new(0x38,mgr,0x1c);
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::list(&local_38,&this->localIPs);
    RTPUDPv6TransmissionInfo::RTPUDPv6TransmissionInfo
              ((RTPUDPv6TransmissionInfo *)this_00,&local_38,this->rtpsock,this->rtcpsock,
               this->portbase,this->portbase + 1);
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::~list(&local_38);
    this_local = this_00;
  }
  return (RTPTransmissionInfo *)this_local;
}

Assistant:

RTPTransmissionInfo *RTPUDPv6Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv6TransmissionInfo(localIPs,rtpsock,rtcpsock,portbase,portbase+1);
	MAINMUTEX_UNLOCK
	return tinf;
}